

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

void __thiscall HvFile::HvFile(HvFile *this,ReadWriter_ptr *r)

{
  _Rb_tree_header *p_Var1;
  
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)this,
             &r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
  (this->_items).
  super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_items).
  super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_items).
  super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_roots)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_roots)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->_roots)._M_t._M_impl.super__Rb_tree_header;
  (this->_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_bootmd5).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_bootmd5).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_bootmd5).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_unkitems).super__Vector_base<HvFile::unkitem,_std::allocator<HvFile::unkitem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unkitems).super__Vector_base<HvFile::unkitem,_std::allocator<HvFile::unkitem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_unkitems).super__Vector_base<HvFile::unkitem,_std::allocator<HvFile::unkitem>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_unkitems).super__Vector_base<HvFile::unkitem,_std::allocator<HvFile::unkitem>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->_roots)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_roots)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_roots)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  readheader(this);
  return;
}

Assistant:

HvFile(ReadWriter_ptr r)
        : _r(r), _rootid(0)
    {
        readheader();
    }